

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_uint64_30_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  uint j;
  word mask2;
  word mask1;
  uint i;
  word idx;
  block_t *Ablock;
  block_t *cblock;
  mzd_local_t *A_local;
  mzd_local_t *v_local;
  mzd_local_t *c_local;
  
  idx = v->w64[1] >> 0x22;
  Ablock = A;
  for (i = 0xf; i != 0; i = i - 1) {
    for (j = 0; j < 2; j = j + 1) {
      c->w64[j] = Ablock->w64[j] & -(idx & 1) ^ Ablock->w64[j + 2] & -(idx >> 1 & 1) ^ c->w64[j];
    }
    idx = idx >> 2;
    Ablock = Ablock + 1;
  }
  return;
}

Assistant:

void mzd_addmul_v_uint64_30_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word idx = CONST_BLOCK(v, 0)->w64[1] >> 34;
  for (unsigned int i = 15; i; --i, idx >>= 2, ++Ablock) {
    const word mask1 = -(idx & 1);
    const word mask2 = -((idx >> 1) & 1);
    for (unsigned int j = 0; j < 2; ++j) {
      cblock->w64[j] ^= (Ablock->w64[j] & mask1) ^ (Ablock->w64[j + 2] & mask2);
    }
  }
}